

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall
Engine::Engine(Engine *this,string *prefix,
              unique_ptr<Handler,_std::default_delete<Handler>_> *handler)

{
  string *in_RSI;
  string *in_RDI;
  value_type *in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            *)0x13c39a);
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

Engine::Engine(std::string prefix, std::unique_ptr<Handler> handler) : prefix(std::move(prefix)) {
    handlers.push_back(std::move(handler));
}